

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePooling3dLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  Pooling3DLayerParams *from;
  allocator local_d9;
  string local_d8;
  undefined1 local_b8 [40];
  Pooling3DLayerParams pooling3d;
  string local_40;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)&pooling3d,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)&pooling3d);
  std::__cxx11::string::~string((string *)&pooling3d._internal_metadata_);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)&pooling3d,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)&pooling3d);
    std::__cxx11::string::~string((string *)&pooling3d._internal_metadata_);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      if (this->ndArrayInterpretation == true) {
        std::__cxx11::string::string((string *)&local_40,"Pooling3d",(allocator *)local_b8);
        validateInputOutputRankEquality((Result *)&pooling3d,layer,&local_40,&this->blobNameToRank);
        Result::operator=(__return_storage_ptr__,(Result *)&pooling3d);
        std::__cxx11::string::~string((string *)&pooling3d._internal_metadata_);
        std::__cxx11::string::~string((string *)&local_40);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
        std::__cxx11::string::string((string *)local_b8,"Pooling3d",(allocator *)&local_d8);
        validateRankCount((Result *)&pooling3d,layer,(string *)local_b8,5,-1,&this->blobNameToRank);
        Result::operator=(__return_storage_ptr__,(Result *)&pooling3d);
        std::__cxx11::string::~string((string *)&pooling3d._internal_metadata_);
        std::__cxx11::string::~string((string *)local_b8);
        bVar1 = Result::good(__return_storage_ptr__);
        if (!bVar1) {
          return __return_storage_ptr__;
        }
      }
      from = Specification::NeuralNetworkLayer::pooling3d(layer);
      Specification::Pooling3DLayerParams::Pooling3DLayerParams(&pooling3d,from);
      std::__cxx11::string::string((string *)&local_d8,"Kernel Depth",&local_d9);
      validatePositive((Result *)local_b8,pooling3d.kerneldepth_,&local_d8);
      Result::operator=(__return_storage_ptr__,(Result *)local_b8);
      std::__cxx11::string::~string((string *)(local_b8 + 8));
      std::__cxx11::string::~string((string *)&local_d8);
      bVar1 = Result::good(__return_storage_ptr__);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_d8,"Kernel Height",&local_d9);
        validatePositive((Result *)local_b8,pooling3d.kernelheight_,&local_d8);
        Result::operator=(__return_storage_ptr__,(Result *)local_b8);
        std::__cxx11::string::~string((string *)(local_b8 + 8));
        std::__cxx11::string::~string((string *)&local_d8);
        bVar1 = Result::good(__return_storage_ptr__);
        if (bVar1) {
          std::__cxx11::string::string((string *)&local_d8,"Kernel Width",&local_d9);
          validatePositive((Result *)local_b8,pooling3d.kernelwidth_,&local_d8);
          Result::operator=(__return_storage_ptr__,(Result *)local_b8);
          std::__cxx11::string::~string((string *)(local_b8 + 8));
          std::__cxx11::string::~string((string *)&local_d8);
          bVar1 = Result::good(__return_storage_ptr__);
          if (bVar1) {
            std::__cxx11::string::string((string *)&local_d8,"Stride Depth",&local_d9);
            validatePositive((Result *)local_b8,pooling3d.stridedepth_,&local_d8);
            Result::operator=(__return_storage_ptr__,(Result *)local_b8);
            std::__cxx11::string::~string((string *)(local_b8 + 8));
            std::__cxx11::string::~string((string *)&local_d8);
            bVar1 = Result::good(__return_storage_ptr__);
            if (bVar1) {
              std::__cxx11::string::string((string *)&local_d8,"Stride Height",&local_d9);
              validatePositive((Result *)local_b8,pooling3d.strideheight_,&local_d8);
              Result::operator=(__return_storage_ptr__,(Result *)local_b8);
              std::__cxx11::string::~string((string *)(local_b8 + 8));
              std::__cxx11::string::~string((string *)&local_d8);
              bVar1 = Result::good(__return_storage_ptr__);
              if (bVar1) {
                std::__cxx11::string::string((string *)&local_d8,"Stride Width",&local_d9);
                validatePositive((Result *)local_b8,pooling3d.stridewidth_,&local_d8);
                Result::operator=(__return_storage_ptr__,(Result *)local_b8);
                std::__cxx11::string::~string((string *)(local_b8 + 8));
                std::__cxx11::string::~string((string *)&local_d8);
                bVar1 = Result::good(__return_storage_ptr__);
                if (bVar1) {
                  std::__cxx11::string::string((string *)&local_d8,"Front",&local_d9);
                  validatePooling3dPadding
                            ((Result *)local_b8,pooling3d.paddingtype_,pooling3d.custompaddingfront_
                             ,&local_d8);
                  Result::operator=(__return_storage_ptr__,(Result *)local_b8);
                  std::__cxx11::string::~string((string *)(local_b8 + 8));
                  std::__cxx11::string::~string((string *)&local_d8);
                  bVar1 = Result::good(__return_storage_ptr__);
                  if (bVar1) {
                    std::__cxx11::string::string((string *)&local_d8,"Back",&local_d9);
                    validatePooling3dPadding
                              ((Result *)local_b8,pooling3d.paddingtype_,
                               pooling3d.custompaddingback_,&local_d8);
                    Result::operator=(__return_storage_ptr__,(Result *)local_b8);
                    std::__cxx11::string::~string((string *)(local_b8 + 8));
                    std::__cxx11::string::~string((string *)&local_d8);
                    bVar1 = Result::good(__return_storage_ptr__);
                    if (bVar1) {
                      std::__cxx11::string::string((string *)&local_d8,"Top",&local_d9);
                      validatePooling3dPadding
                                ((Result *)local_b8,pooling3d.paddingtype_,
                                 pooling3d.custompaddingtop_,&local_d8);
                      Result::operator=(__return_storage_ptr__,(Result *)local_b8);
                      std::__cxx11::string::~string((string *)(local_b8 + 8));
                      std::__cxx11::string::~string((string *)&local_d8);
                      bVar1 = Result::good(__return_storage_ptr__);
                      if (bVar1) {
                        std::__cxx11::string::string((string *)&local_d8,"Bottom",&local_d9);
                        validatePooling3dPadding
                                  ((Result *)local_b8,pooling3d.paddingtype_,
                                   pooling3d.custompaddingbottom_,&local_d8);
                        Result::operator=(__return_storage_ptr__,(Result *)local_b8);
                        std::__cxx11::string::~string((string *)(local_b8 + 8));
                        std::__cxx11::string::~string((string *)&local_d8);
                        bVar1 = Result::good(__return_storage_ptr__);
                        if (bVar1) {
                          std::__cxx11::string::string((string *)&local_d8,"Left",&local_d9);
                          validatePooling3dPadding
                                    ((Result *)local_b8,pooling3d.paddingtype_,
                                     pooling3d.custompaddingleft_,&local_d8);
                          Result::operator=(__return_storage_ptr__,(Result *)local_b8);
                          std::__cxx11::string::~string((string *)(local_b8 + 8));
                          std::__cxx11::string::~string((string *)&local_d8);
                          bVar1 = Result::good(__return_storage_ptr__);
                          if (bVar1) {
                            std::__cxx11::string::string((string *)&local_d8,"Right",&local_d9);
                            validatePooling3dPadding
                                      ((Result *)local_b8,pooling3d.paddingtype_,
                                       pooling3d.custompaddingright_,&local_d8);
                            Result::operator=(__return_storage_ptr__,(Result *)local_b8);
                            std::__cxx11::string::~string((string *)(local_b8 + 8));
                            std::__cxx11::string::~string((string *)&local_d8);
                            Result::good(__return_storage_ptr__);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      Specification::Pooling3DLayerParams::~Pooling3DLayerParams(&pooling3d);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePooling3dLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) { return r; }
    
    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) { return r; }
    
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Pooling3d", blobNameToRank);
        if (!r.good()) { return r; }
        // Rank 5 for 2 spacial dimensions, 1 temporal dimension, batch dimension, and 1+ channels.
        r = validateRankCount(layer, "Pooling3d", 5, -1, blobNameToRank);
        if (!r.good()) { return r; }
    }
    
    // Kernel
    const auto pooling3d = layer.pooling3d();
   
    r = validatePositive(pooling3d.kerneldepth(), "Kernel Depth");
    if (!r.good()) { return r; }

    r = validatePositive(pooling3d.kernelheight(), "Kernel Height");
    if (!r.good()) { return r; }

    r = validatePositive(pooling3d.kernelwidth(), "Kernel Width");
    if (!r.good()) { return r; }

    // Stride
    r = validatePositive(pooling3d.stridedepth(), "Stride Depth");
    if (!r.good()) { return r; }
    
    r = validatePositive(pooling3d.strideheight(), "Stride Height");
    if (!r.good()) { return r; }
    
    r = validatePositive(pooling3d.stridewidth(), "Stride Width");
    if (!r.good()) { return r; }
    
    // Custom Padding
    auto paddingType = pooling3d.paddingtype();
    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingfront(), "Front");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingback(), "Back");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingtop(), "Top");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingbottom(), "Bottom");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingleft(), "Left");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingright(), "Right");
    if (!r.good()) { return r; }
    
    return r;
}